

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O1

BinOpr subexpr(LexState *ls,expdesc *v,int limit)

{
  unsigned_short *puVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  BinOpr BVar5;
  TString *pTVar6;
  ushort uVar7;
  BinOpr op;
  UnOpr op_00;
  expdesc v2;
  expdesc local_68;
  
  uVar7 = ls->L->nCcalls + 1;
  ls->L->nCcalls = uVar7;
  if (0x7d < uVar7) {
    errorlimit(ls->fs,0x7d,"C levels");
  }
  iVar4 = (ls->t).token;
  if (iVar4 < 0x7e) {
    if (iVar4 == 0x23) {
      op_00 = OPR_LEN;
      goto LAB_001360b6;
    }
    if (iVar4 == 0x2d) {
      bVar2 = false;
      bVar3 = false;
      op_00 = OPR_MINUS;
    }
    else {
      if (iVar4 != 0x40) goto LAB_00136076;
      op_00 = OPR_TO_TYPE;
      bVar3 = true;
      bVar2 = false;
    }
  }
  else {
    switch(iVar4) {
    case 0x127:
      op_00 = OPR_TO_INTEGER;
      break;
    case 0x128:
      op_00 = OPR_TO_NUMBER;
      break;
    case 0x129:
      op_00 = OPR_TO_INTARRAY;
      break;
    case 0x12a:
      op_00 = OPR_TO_NUMARRAY;
      break;
    case 299:
      op_00 = OPR_TO_TABLE;
      break;
    case 300:
      op_00 = OPR_TO_STRING;
      break;
    case 0x12d:
      op_00 = OPR_TO_CLOSURE;
      break;
    default:
      if (iVar4 == 0x7e) {
        op_00 = OPR_BNOT;
        break;
      }
      if (iVar4 == 0x110) {
        op_00 = OPR_NOT;
        break;
      }
LAB_00136076:
      op_00 = OPR_NOUNOPR;
      bVar2 = true;
      goto LAB_001360b8;
    }
LAB_001360b6:
    bVar2 = false;
LAB_001360b8:
    bVar3 = false;
  }
  if (bVar2) {
    if (iVar4 < 0x115) {
      if (iVar4 < 0x109) {
        if (iVar4 == 0x7b) {
          constructor(ls,v);
        }
        else {
          if (iVar4 == 0x107) {
            v->t = -1;
            v->f = -1;
            v->k = VFALSE;
            (v->u).info = 0;
            v->ravi_type_map = 2;
            goto LAB_001362ea;
          }
LAB_0013645c:
          suffixedexp(ls,v);
        }
      }
      else {
        if (iVar4 != 0x109) {
          if (iVar4 == 0x10f) {
            v->t = -1;
            v->f = -1;
            v->k = VNIL;
            (v->u).info = 0;
            v->ravi_type_map = 1;
            goto LAB_001362ea;
          }
          goto LAB_0013645c;
        }
        luaX_next(ls);
        body(ls,v,0,ls->linenumber,0);
      }
    }
    else {
      if (iVar4 < 0x123) {
        if (iVar4 == 0x115) {
          v->t = -1;
          v->f = -1;
          v->k = VTRUE;
          (v->u).info = 0;
          v->ravi_type_map = 4;
          goto LAB_001362ea;
        }
        if (iVar4 != 0x11a) goto LAB_0013645c;
        if (ls->fs->f->is_vararg == '\0') {
          luaX_syntaxerror(ls,"cannot use \'...\' outside a vararg function");
        }
        iVar4 = luaK_codeABC(ls->fs,OP_VARARG,0,1,0);
        v->t = -1;
        v->f = -1;
        v->k = VVARARG;
        (v->u).info = iVar4;
        v->ravi_type_map = 0xffffffff;
        v->usertype = (TString *)0x0;
        v->pc = -1;
        (v->u).ind.usertype = (TString *)0x0;
      }
      else if (iVar4 == 0x126) {
        iVar4 = luaK_stringK(ls->fs,(ls->t).seminfo.ts);
        v->t = -1;
        v->f = -1;
        v->k = VK;
        (v->u).info = iVar4;
        v->ravi_type_map = 0x100;
LAB_001362ea:
        v->usertype = (TString *)0x0;
        v->pc = -1;
        (v->u).ind.usertype = (TString *)0x0;
      }
      else if (iVar4 == 0x124) {
        v->t = -1;
        v->f = -1;
        v->k = VKINT;
        (v->u).info = 0;
        v->ravi_type_map = 8;
        v->usertype = (TString *)0x0;
        v->pc = -1;
        (v->u).ind.usertype = (TString *)0x0;
        (v->u).ival = (lua_Integer)(ls->t).seminfo;
      }
      else {
        if (iVar4 != 0x123) goto LAB_0013645c;
        v->t = -1;
        v->f = -1;
        v->k = VKFLT;
        (v->u).info = 0;
        v->ravi_type_map = 0x10;
        v->usertype = (TString *)0x0;
        v->pc = -1;
        (v->u).ind.usertype = (TString *)0x0;
        (v->u).ival = (lua_Integer)(ls->t).seminfo;
      }
      luaX_next(ls);
    }
    if (((byte)ravi_parser_debug & 1) != 0) {
      raviY_printf(ls->fs,"subexpr -> simpleexpr %e\n",v);
    }
  }
  else {
    iVar4 = ls->linenumber;
    if (bVar3) {
      pTVar6 = (ls->t).seminfo.ts;
      luaX_next(ls);
      pTVar6 = user_defined_type_name(ls,pTVar6);
    }
    else {
      luaX_next(ls);
      pTVar6 = (TString *)0x0;
    }
    subexpr(ls,v,0xc);
    luaK_prefix(ls->fs,op_00,v,iVar4,pTVar6);
  }
  iVar4 = (ls->t).token;
  if (iVar4 < 0x7e) {
    if (iVar4 < 0x3c) {
      switch(iVar4) {
      case 0x25:
        op = OPR_MOD;
        break;
      case 0x26:
        op = OPR_BAND;
        break;
      default:
        goto switchD_00136353_caseD_27;
      case 0x2a:
        op = OPR_MUL;
        break;
      case 0x2b:
        bVar2 = false;
        op = OPR_ADD;
        goto LAB_001364ce;
      case 0x2d:
        op = OPR_SUB;
        break;
      case 0x2f:
        op = OPR_DIV;
      }
    }
    else if (iVar4 < 0x5e) {
      if (iVar4 == 0x3c) {
        op = OPR_LT;
      }
      else {
        if (iVar4 != 0x3e) goto switchD_00136353_caseD_27;
        op = OPR_GT;
      }
    }
    else if (iVar4 == 0x5e) {
      op = OPR_POW;
    }
    else {
      if (iVar4 != 0x7c) goto switchD_00136353_caseD_27;
      op = OPR_BOR;
    }
  }
  else {
    switch(iVar4) {
    case 0x111:
      op = OPR_OR;
      break;
    case 0x112:
    case 0x113:
    case 0x114:
    case 0x115:
    case 0x116:
    case 0x117:
    case 0x11a:
switchD_00136353_caseD_27:
      op = OPR_NOBINOPR;
      bVar2 = true;
      goto LAB_001364ce;
    case 0x118:
      op = OPR_IDIV;
      break;
    case 0x119:
      op = OPR_CONCAT;
      break;
    case 0x11b:
      op = OPR_EQ;
      break;
    case 0x11c:
      op = OPR_GE;
      break;
    case 0x11d:
      op = OPR_LE;
      break;
    case 0x11e:
      op = OPR_NE;
      break;
    case 0x11f:
      op = OPR_SHL;
      break;
    case 0x120:
      op = OPR_SHR;
      break;
    default:
      if (iVar4 == 0x7e) {
        op = OPR_BXOR;
      }
      else {
        if (iVar4 != 0x101) goto switchD_00136353_caseD_27;
        op = OPR_AND;
      }
    }
  }
  bVar2 = false;
LAB_001364ce:
  if (!bVar2) {
    do {
      if ((int)(uint)priority[op].left <= limit) break;
      local_68.usertype = (TString *)0x0;
      local_68.k = VVOID;
      local_68._4_4_ = 0;
      local_68.u.ival = 0;
      local_68.u.ind.usertype = (TString *)0x0;
      local_68.t = 0;
      local_68.f = 0;
      local_68.ravi_type_map = 0xffffffff;
      local_68._36_4_ = 0;
      local_68.pc = -1;
      local_68._52_4_ = 0;
      iVar4 = ls->linenumber;
      luaX_next(ls);
      luaK_infix(ls->fs,op,v);
      BVar5 = subexpr(ls,&local_68,(uint)priority[op].right);
      if (((byte)ravi_parser_debug & 1) != 0) {
        raviY_printf(ls->fs,"subexpr-> %e binop(%d) %e\n",v,(ulong)op,&local_68);
      }
      luaK_posfix(ls->fs,op,v,&local_68,iVar4);
      if (((byte)ravi_parser_debug & 1) != 0) {
        raviY_printf(ls->fs,"subexpr-> after posfix %e\n",v);
      }
      op = BVar5;
    } while (BVar5 != OPR_NOBINOPR);
  }
  puVar1 = &ls->L->nCcalls;
  *puVar1 = *puVar1 - 1;
  return op;
}

Assistant:

static BinOpr subexpr (LexState *ls, expdesc *v, int limit) {
  BinOpr op;
  UnOpr uop;
  enterlevel(ls);
  uop = getunopr(ls->t.token);
  if (uop != OPR_NOUNOPR) {
    int line = ls->linenumber;
	// RAVI change - get usertype if @<name>
    TString *usertype = NULL;
    if (uop == OPR_TO_TYPE) {
      usertype = ls->t.seminfo.ts;
      luaX_next(ls);
      // Check and expand to extended name if necessary
      usertype = user_defined_type_name(ls, usertype);
    }
    else {
      luaX_next(ls);
    }
    subexpr(ls, v, UNARY_PRIORITY);
    luaK_prefix(ls->fs, uop, v, line, usertype);
  }
  else {
    simpleexp(ls, v);
    DEBUG_EXPR(raviY_printf(ls->fs, "subexpr -> simpleexpr %e\n", v));
  }
  /* expand while operators have priorities higher than 'limit' */
  op = getbinopr(ls->t.token);
  while (op != OPR_NOBINOPR && priority[op].left > limit) {
    expdesc v2 = {.ravi_type_map = RAVI_TM_ANY, .pc = -1};
    BinOpr nextop;
    int line = ls->linenumber;
    luaX_next(ls);
    luaK_infix(ls->fs, op, v);
    /* read sub-expression with higher priority */
    nextop = subexpr(ls, &v2, priority[op].right);
    DEBUG_EXPR(raviY_printf(ls->fs, "subexpr-> %e binop(%d) %e\n", v, (int)op, &v2));
    
    luaK_posfix(ls->fs, op, v, &v2, line);
    DEBUG_EXPR(raviY_printf(ls->fs, "subexpr-> after posfix %e\n", v));
    op = nextop;
  }
  leavelevel(ls);
  return op;  /* return first untreated operator */
}